

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<float,_unsigned_short>::Run
          (DataTransform<float,_unsigned_short> *this,istream *input_stream)

{
  ushort uVar1;
  NumericType NVar2;
  WarningType WVar3;
  float fVar4;
  ostream *poVar5;
  size_t *__idx;
  ulong uVar6;
  ushort data_to_write;
  int iVar7;
  bool bVar8;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  allocator local_269;
  float input_data;
  uint local_264;
  float local_260;
  uint local_25c;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_258 = &this->print_format_;
  iVar7 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar8 = word._M_string_length == 0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (float)in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_001302d3;
      if (bVar8) {
        if (bVar8) {
LAB_001304e5:
          bVar8 = true;
          if ((this->is_ascii_output_ == true) && (iVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00130507:
          bVar8 = false;
        }
        return bVar8;
      }
    }
    else {
      bVar8 = sptk::ReadStream<float>(&input_data,input_stream);
      if (!bVar8) goto LAB_001304e5;
LAB_001302d3:
      data_to_write = this->minimum_value_;
      uVar1 = this->maximum_value_;
      if (data_to_write < uVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_260 = input_data;
          local_25c = (uint)data_to_write;
          in_ST6 = in_ST5;
          if (((float)local_25c <= input_data) &&
             (local_264 = (uint)uVar1, data_to_write = uVar1, input_data <= (float)local_264))
          goto LAB_0013038f;
        }
        else if (NVar2 == kUnsignedInteger) {
          uVar6 = (long)(input_data - 9.223372e+18) & (long)input_data >> 0x3f | (long)input_data;
          if (data_to_write <= uVar6) {
LAB_00130355:
            bVar8 = uVar1 < uVar6;
            data_to_write = (ushort)(int)input_data;
            if (bVar8) {
              data_to_write = uVar1;
            }
            goto LAB_00130391;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0013038f;
          uVar6 = (ulong)input_data;
          if ((long)(ulong)data_to_write <= (long)uVar6) goto LAB_00130355;
        }
LAB_001303bb:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_269);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) goto LAB_00130507;
        }
      }
      else {
LAB_0013038f:
        bVar8 = false;
        data_to_write = (ushort)(int)input_data;
LAB_00130391:
        if ((bVar8) || (this->rounding_ == false)) {
          if (bVar8) goto LAB_001303bb;
        }
        else {
          if (input_data <= 0.0) {
            fVar4 = input_data + -0.5;
          }
          else {
            fVar4 = input_data + 0.5;
          }
          data_to_write = (ushort)(int)fVar4;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<unsigned_short>(data_to_write,local_258,0x80,buffer);
        if (!bVar8) goto LAB_00130507;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar8 = sptk::WriteStream<unsigned_short>(data_to_write,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar8) goto LAB_00130507;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }